

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  void *pvVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  void *pvVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  void *pvVar15;
  int iVar16;
  void *pvVar17;
  byte *pbVar18;
  int iVar19;
  int iVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  Mat local_78;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar7 = (float *)__return_storage_ptr__->data;
      if ((pfVar7 != (float *)0x0) &&
         ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
        iVar27 = 1;
        iVar22 = h;
        if (stride - w == 0) {
          iVar27 = h;
          iVar22 = 1;
        }
        if (0 < iVar22) {
          iVar16 = 0;
          pbVar18 = pixels;
          do {
            iVar19 = iVar27 * w + 1;
            if (0 < iVar27 * w) {
              do {
                *pfVar7 = (float)*pbVar18;
                pbVar18 = pbVar18 + 1;
                pfVar7 = pfVar7 + 1;
                iVar19 = iVar19 + -1;
              } while (1 < iVar19);
            }
            pbVar18 = pbVar18 + (stride - w);
            iVar16 = iVar16 + 1;
          } while (iVar16 != iVar22);
        }
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if (pfVar7 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar22 = stride + w * -4;
    iVar27 = 1;
    if (iVar22 == 0) {
      iVar27 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar12 = (float *)((long)pfVar7 + lVar8 * 2);
    pfVar9 = (float *)(lVar8 + (long)pfVar7);
    pfVar14 = (float *)(lVar8 * 3 + (long)pfVar7);
    iVar16 = 0;
    do {
      iVar19 = iVar27 * w + 1;
      if (0 < iVar27 * w) {
        do {
          *pfVar7 = (float)*pixels;
          *pfVar9 = (float)pixels[1];
          *pfVar12 = (float)pixels[2];
          *pfVar14 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar7 = pfVar7 + 1;
          pfVar9 = pfVar9 + 1;
          pfVar12 = pfVar12 + 1;
          pfVar14 = pfVar14 + 1;
          iVar19 = iVar19 + -1;
        } while (1 < iVar19);
      }
      pixels = pixels + iVar22;
      iVar16 = iVar16 + 1;
    } while (iVar16 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x30001) {
    switch(type) {
    case 0x10002:
switchD_00141958_caseD_20001:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10003:
switchD_00141958_caseD_20003:
      from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10004:
switchD_00141958_caseD_20005:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar7 = (float *)__return_storage_ptr__->data;
      if (pfVar7 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar22 = stride + w * -4;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar12 = (float *)((long)pfVar7 + lVar8);
      pfVar9 = (float *)((long)pfVar7 + lVar8 * 2);
      iVar16 = 0;
      do {
        iVar19 = iVar27 * w + 1;
        if (0 < iVar27 * w) {
          do {
            *pfVar7 = (float)*pixels;
            *pfVar12 = (float)pixels[1];
            *pfVar9 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar7 = pfVar7 + 1;
            pfVar12 = pfVar12 + 1;
            pfVar9 = pfVar9 + 1;
            iVar19 = iVar19 + -1;
          } while (1 < iVar19);
        }
        pixels = pixels + iVar22;
        iVar16 = iVar16 + 1;
      } while (iVar16 != h);
      return __return_storage_ptr__;
    case 0x10005:
switchD_00141958_caseD_20004:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar7 = (float *)__return_storage_ptr__->data;
      if (pfVar7 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar22 = stride + w * -4;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar12 = (float *)((long)pfVar7 + lVar8);
      pfVar9 = (float *)((long)pfVar7 + lVar8 * 2);
      iVar16 = 0;
      do {
        iVar19 = iVar27 * w + 1;
        if (0 < iVar27 * w) {
          do {
            *pfVar7 = (float)pixels[2];
            *pfVar12 = (float)pixels[1];
            *pfVar9 = (float)*pixels;
            pixels = pixels + 4;
            pfVar7 = pfVar7 + 1;
            pfVar12 = pfVar12 + 1;
            pfVar9 = pfVar9 + 1;
            iVar19 = iVar19 + -1;
          } while (1 < iVar19);
        }
        pixels = pixels + iVar22;
        iVar16 = iVar16 + 1;
      } while (iVar16 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x20001:
        goto switchD_00141958_caseD_20001;
      default:
        goto switchD_00141928_default;
      case 0x20003:
        goto switchD_00141958_caseD_20003;
      case 0x20004:
        goto switchD_00141958_caseD_20004;
      case 0x20005:
        goto switchD_00141958_caseD_20005;
      }
    }
  }
  switch(type) {
  case 0x30001:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar22 = stride + w * -3;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (0 < h) {
        iVar16 = 0;
        do {
          iVar19 = iVar27 * w + 1;
          if (0 < iVar27 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar7 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar7 = pfVar7 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          pixels = pixels + iVar22;
          iVar16 = iVar16 + 1;
        } while (iVar16 != h);
      }
    }
    break;
  case 0x30002:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar22 = stride + w * -3;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (0 < h) {
        iVar16 = 0;
        do {
          iVar19 = iVar27 * w + 1;
          if (0 < iVar27 * w) {
            do {
              bVar1 = *pixels;
              *pfVar7 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar7 = pfVar7 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          pixels = pixels + iVar22;
          iVar16 = iVar16 + 1;
        } while (iVar16 != h);
      }
    }
    break;
  case 0x30003:
switchD_00141928_default:
    from_pixels((Mat *)(ulong)(uint)type);
    return __return_storage_ptr__;
  case 0x30004:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar22 = stride + w * -4;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (0 < h) {
        iVar16 = 0;
        do {
          iVar19 = iVar27 * w + 1;
          if (0 < iVar27 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar7 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar7 = pfVar7 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          pixels = pixels + iVar22;
          iVar16 = iVar16 + 1;
        } while (iVar16 != h);
      }
    }
    break;
  case 0x30005:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar22 = stride + w * -4;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (0 < h) {
        iVar16 = 0;
        do {
          iVar19 = iVar27 * w + 1;
          if (0 < iVar27 * w) {
            do {
              bVar1 = *pixels;
              *pfVar7 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar7 = pfVar7 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          pixels = pixels + iVar22;
          iVar16 = iVar16 + 1;
        } while (iVar16 != h);
      }
    }
    break;
  default:
    switch(type) {
    case 0x40001:
switchD_00141928_caseD_50002:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      if (__return_storage_ptr__->dims == 3) {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 3;
        local_78.d = 1;
        local_78.c = 3;
        lVar8 = (long)local_78.h * (long)local_78.w * local_78.elemsize;
      }
      else {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 4;
        local_78.c = 3;
        local_78.d = __return_storage_ptr__->d;
        lVar8 = (long)local_78.h * (long)local_78.w *
                (long)__return_storage_ptr__->d * local_78.elemsize;
      }
      local_78.refcount = (int *)0x0;
      local_78.cstep = (lVar8 + 0xfU & 0xfffffffffffffff0) / local_78.elemsize;
      from_rgb(pixels,w,h,stride,&local_78,allocator);
      auVar4 = _DAT_00316360;
      auVar3 = _DAT_00316350;
      auVar2 = _DAT_003162e0;
      iVar22 = 1;
      if (__return_storage_ptr__->dims != 3) {
        iVar22 = __return_storage_ptr__->d;
      }
      uVar5 = __return_storage_ptr__->h * __return_storage_ptr__->w * iVar22;
      if (0 < (int)uVar5) {
        pvVar6 = __return_storage_ptr__->data;
        lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
        lVar13 = (ulong)uVar5 - 1;
        auVar21._8_4_ = (int)lVar13;
        auVar21._0_8_ = lVar13;
        auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar11 = 0;
        auVar21 = auVar21 ^ _DAT_003162e0;
        do {
          auVar25._8_4_ = (int)uVar11;
          auVar25._0_8_ = uVar11;
          auVar25._12_4_ = (int)(uVar11 >> 0x20);
          auVar20 = (auVar25 | auVar4) ^ auVar2;
          iVar22 = auVar21._4_4_;
          if ((bool)(~(auVar20._4_4_ == iVar22 && auVar21._0_4_ < auVar20._0_4_ ||
                      iVar22 < auVar20._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3) = 0x437f0000;
          }
          if ((auVar20._12_4_ != auVar21._12_4_ || auVar20._8_4_ <= auVar21._8_4_) &&
              auVar20._12_4_ <= auVar21._12_4_) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 4) = 0x437f0000;
          }
          auVar20 = (auVar25 | auVar3) ^ auVar2;
          iVar27 = auVar20._4_4_;
          if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar20._0_4_ <= auVar21._0_4_)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 0xc) = 0x437f0000;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar5 + 3 & 0xfffffffc) != uVar11);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
      break;
    case 0x40002:
switchD_00141928_caseD_50001:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      if (__return_storage_ptr__->dims == 3) {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 3;
        local_78.d = 1;
        local_78.c = 3;
        lVar8 = (long)local_78.h * (long)local_78.w * local_78.elemsize;
      }
      else {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 4;
        local_78.c = 3;
        local_78.d = __return_storage_ptr__->d;
        lVar8 = (long)local_78.h * (long)local_78.w *
                (long)__return_storage_ptr__->d * local_78.elemsize;
      }
      local_78.refcount = (int *)0x0;
      local_78.cstep = (lVar8 + 0xfU & 0xfffffffffffffff0) / local_78.elemsize;
      from_rgb2bgr(pixels,w,h,stride,&local_78,allocator);
      auVar4 = _DAT_00316360;
      auVar3 = _DAT_00316350;
      auVar2 = _DAT_003162e0;
      iVar22 = 1;
      if (__return_storage_ptr__->dims != 3) {
        iVar22 = __return_storage_ptr__->d;
      }
      uVar5 = __return_storage_ptr__->h * __return_storage_ptr__->w * iVar22;
      if (0 < (int)uVar5) {
        pvVar6 = __return_storage_ptr__->data;
        lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
        lVar13 = (ulong)uVar5 - 1;
        auVar26._8_4_ = (int)lVar13;
        auVar26._0_8_ = lVar13;
        auVar26._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar11 = 0;
        auVar26 = auVar26 ^ _DAT_003162e0;
        do {
          auVar24._8_4_ = (int)uVar11;
          auVar24._0_8_ = uVar11;
          auVar24._12_4_ = (int)(uVar11 >> 0x20);
          auVar20 = (auVar24 | auVar4) ^ auVar2;
          iVar22 = auVar26._4_4_;
          if ((bool)(~(auVar20._4_4_ == iVar22 && auVar26._0_4_ < auVar20._0_4_ ||
                      iVar22 < auVar20._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3) = 0x437f0000;
          }
          if ((auVar20._12_4_ != auVar26._12_4_ || auVar20._8_4_ <= auVar26._8_4_) &&
              auVar20._12_4_ <= auVar26._12_4_) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 4) = 0x437f0000;
          }
          auVar20 = (auVar24 | auVar3) ^ auVar2;
          iVar27 = auVar20._4_4_;
          if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar20._0_4_ <= auVar26._0_4_)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 0xc) = 0x437f0000;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar5 + 3 & 0xfffffffc) != uVar11);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
      break;
    case 0x40003:
switchD_00141928_caseD_50003:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      if (__return_storage_ptr__->dims == 3) {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 3;
        local_78.d = 1;
        local_78.c = 3;
        lVar8 = (long)local_78.h * (long)local_78.w * local_78.elemsize;
      }
      else {
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.dims = 4;
        local_78.c = 3;
        local_78.d = __return_storage_ptr__->d;
        lVar8 = (long)local_78.h * (long)local_78.w *
                (long)__return_storage_ptr__->d * local_78.elemsize;
      }
      local_78.refcount = (int *)0x0;
      local_78.cstep = (lVar8 + 0xfU & 0xfffffffffffffff0) / local_78.elemsize;
      from_gray2rgb(pixels,w,h,stride,&local_78,allocator);
      auVar4 = _DAT_00316360;
      auVar3 = _DAT_00316350;
      auVar2 = _DAT_003162e0;
      iVar22 = 1;
      if (__return_storage_ptr__->dims != 3) {
        iVar22 = __return_storage_ptr__->d;
      }
      uVar5 = __return_storage_ptr__->h * __return_storage_ptr__->w * iVar22;
      if (0 < (int)uVar5) {
        pvVar6 = __return_storage_ptr__->data;
        lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
        lVar13 = (ulong)uVar5 - 1;
        auVar20._8_4_ = (int)lVar13;
        auVar20._0_8_ = lVar13;
        auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar11 = 0;
        auVar20 = auVar20 ^ _DAT_003162e0;
        do {
          auVar23._8_4_ = (int)uVar11;
          auVar23._0_8_ = uVar11;
          auVar23._12_4_ = (int)(uVar11 >> 0x20);
          auVar26 = (auVar23 | auVar4) ^ auVar2;
          iVar22 = auVar20._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar22 && auVar20._0_4_ < auVar26._0_4_ ||
                      iVar22 < auVar26._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3) = 0x437f0000;
          }
          if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
              auVar26._12_4_ <= auVar20._12_4_) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 4) = 0x437f0000;
          }
          auVar23 = (auVar23 | auVar3) ^ auVar2;
          iVar27 = auVar23._4_4_;
          if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar23._0_4_ <= auVar20._0_4_)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + lVar8 * 3 + 0xc) = 0x437f0000;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar5 + 3 & 0xfffffffc) != uVar11);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
      break;
    case 0x40004:
      goto switchD_00141928_default;
    case 0x40005:
switchD_00141928_caseD_50004:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      pvVar6 = __return_storage_ptr__->data;
      if (pvVar6 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar22 = stride + w * -4;
      iVar27 = 1;
      if (iVar22 == 0) {
        iVar27 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar8 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pvVar17 = (void *)((long)pvVar6 + lVar8 * 2);
      pvVar10 = (void *)(lVar8 + (long)pvVar6);
      pvVar15 = (void *)(lVar8 * 3 + (long)pvVar6);
      iVar16 = 0;
      do {
        if (0 < iVar27 * w) {
          lVar8 = 0;
          iVar19 = iVar27 * w + 1;
          do {
            *(float *)((long)pvVar6 + lVar8) = (float)pixels[lVar8 + 2];
            *(float *)((long)pvVar10 + lVar8) = (float)pixels[lVar8 + 1];
            *(float *)((long)pvVar17 + lVar8) = (float)pixels[lVar8];
            *(float *)((long)pvVar15 + lVar8) = (float)pixels[lVar8 + 3];
            iVar19 = iVar19 + -1;
            lVar8 = lVar8 + 4;
          } while (1 < iVar19);
          pvVar15 = (void *)((long)pvVar15 + lVar8);
          pvVar17 = (void *)((long)pvVar17 + lVar8);
          pvVar10 = (void *)((long)pvVar10 + lVar8);
          pvVar6 = (void *)((long)pvVar6 + lVar8);
          pixels = pixels + lVar8;
        }
        pixels = pixels + iVar22;
        iVar16 = iVar16 + 1;
      } while (iVar16 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x50001:
        goto switchD_00141928_caseD_50001;
      case 0x50002:
        goto switchD_00141928_caseD_50002;
      case 0x50003:
        goto switchD_00141928_caseD_50003;
      case 0x50004:
        goto switchD_00141928_caseD_50004;
      default:
        goto switchD_00141928_default;
      }
    }
    if (local_78.data != (void *)0x0) {
      free(local_78.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}